

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* generateResults(pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *__return_storage_ptr__,RestCommand command,string *brokerName,string_view target,
                 string_view query,
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 *fields)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  number_unsigned_t nVar3;
  object_t *poVar4;
  element_type *peVar5;
  uuid uVar6;
  uuid uVar7;
  bool bVar8;
  CoreType type_00;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  reference pvVar13;
  TimeRepresentation<count_time<9,_long>_> TVar14;
  size_type sVar15;
  json_value jVar16;
  char *pcVar17;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  json_value jVar18;
  string *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  char *pcVar20;
  string_view timeString;
  string_view type_01;
  string_view brokerName_00;
  string_view configureString;
  basic_string_view<char,_std::char_traits<char>_> __x;
  initializer_list_t init;
  string_view brokerName_01;
  string_view brokerName_02;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view brokerName_03;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  char *pcStackY_330;
  bool useUuid_1;
  bool useUuid;
  json_value local_310;
  shared_ptr<helics::Broker> brkr;
  key_type local_2e8;
  random_generator generator;
  uuid uuid1;
  json base;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  string res;
  string type_1;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brks;
  undefined3 uStack_f7;
  undefined4 uStack_f4;
  json_value local_f0 [8];
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a8;
  string errorMessage;
  string type;
  data local_60;
  data local_50;
  data local_40;
  
  pcVar17 = target._M_str;
  local_310.number_integer = target._M_len;
  if ((generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
       ::emptyString_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                                   ::emptyString_abi_cxx11_), iVar9 != 0)) {
    generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
    ::emptyString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                   ::emptyString_abi_cxx11_.field_2;
    generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
    ::emptyString_abi_cxx11_._M_string_length = 0;
    generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
    ::emptyString_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                  ::emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                         ::emptyString_abi_cxx11_);
  }
  if (command == UNKNOWN) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[8]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [8])fields);
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) goto switchD_001a0c14_caseD_6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&res,"command",(allocator<char> *)&brks);
    pbVar10 = boost::container::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              ::at(fields,&res);
    std::__cxx11::string::~string((string *)&res);
    res._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    res._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
    cVar11 = CLI::std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&commandMap._M_h,(key_type *)&res);
    if (cVar11.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_true>
        ._M_cur == (__node_type *)0x0) goto switchD_001a0c14_caseD_6;
    res._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    res._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
    pmVar12 = CLI::std::__detail::
              _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&commandMap,(key_type *)&res);
    command = *pmVar12;
    bVar8 = std::operator==(pbVar10,"status");
    if (bVar8) {
      query._M_len = 6;
      query._M_str = "status";
    }
  }
  switch(command) {
  case QUERY:
    bVar8 = std::operator==(brokerName,"query");
    if (!bVar8) {
      bVar8 = std::operator==(brokerName,"search");
      command = QUERY;
      if (!bVar8) break;
    }
    brokerName->_M_string_length = 0;
    *(brokerName->_M_dataplus)._M_p = '\0';
    command = QUERY;
    break;
  case CREATE:
    bVar8 = std::operator==(brokerName,"create");
    if (bVar8) {
      brokerName->_M_string_length = 0;
      *(brokerName->_M_dataplus)._M_p = '\0';
      command = CREATE;
    }
    else {
      bVar8 = std::operator==(brokerName,"barrier");
      if (bVar8) {
        brokerName->_M_string_length = 0;
        *(brokerName->_M_dataplus)._M_p = '\0';
        command = BARRIER;
      }
      else {
        __x._M_str = pcVar17;
        __x._M_len = (size_t)local_310;
        __y._M_str = "barrier";
        __y._M_len = 7;
        bVar8 = std::operator==(__x,__y);
        command = (uint)bVar8 * 2 + CREATE;
      }
    }
    break;
  case REMOVE:
    bVar8 = std::operator==(brokerName,"delete");
    if ((bVar8) || (bVar8 = std::operator==(brokerName,"remove"), bVar8)) {
      brokerName->_M_string_length = 0;
      *(brokerName->_M_dataplus)._M_p = '\0';
      command = REMOVE;
    }
    else {
      bVar8 = std::operator==(brokerName,"barrier");
      if (bVar8) {
        brokerName->_M_string_length = 0;
        *(brokerName->_M_dataplus)._M_p = '\0';
        command = CLEAR_BARRIER;
      }
      else {
        __x_02._M_str = pcVar17;
        __x_02._M_len = (size_t)local_310;
        __y_02._M_str = "barrier";
        __y_02._M_len = 7;
        bVar8 = std::operator==(__x_02,__y_02);
        command = (uint)bVar8 * 2 + REMOVE;
      }
    }
    break;
  case UNKNOWN:
switchD_001a0c14_caseD_6:
    res._M_dataplus._M_p._0_4_ = 0x1f5;
    CLI::std::
    pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<RequestReturnVal,_const_char_(&)[23],_true>
              (__return_storage_ptr__,(RequestReturnVal *)&res,
               (char (*) [23])"command not recognized");
    return __return_storage_ptr__;
  }
  jVar18 = (json_value)query._M_len;
  if (query._M_len == 0) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[6]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [6])fields);
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      jVar18 = (json_value)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"query",(allocator<char> *)&brks);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      query._M_str = (pbVar10->_M_dataplus)._M_p;
      jVar18 = (json_value)pbVar10->_M_string_length;
      std::__cxx11::string::~string((string *)&res);
      query._M_len = (size_t)jVar18;
    }
  }
  if (local_310 == (json_value)0x0) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[7]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [7])fields);
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      local_310 = (json_value)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"target",(allocator<char> *)&brks);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      pcVar17 = (pbVar10->_M_dataplus)._M_p;
      local_310 = (json_value)pbVar10->_M_string_length;
      std::__cxx11::string::~string((string *)&res);
    }
  }
  if (brokerName->_M_string_length == 0) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[7]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [7])fields);
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[12]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        *)&res,(char (*) [12])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"broker_uuid",(allocator<char> *)&brks);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&res);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(brokerName,pbVar10);
        goto LAB_001a0f80;
      }
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[5]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                       *)&res,(char (*) [5])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"uuid",(allocator<char> *)&brks);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&res);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(brokerName,pbVar10);
        goto LAB_001a0f80;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"broker",(allocator<char> *)&brks);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(brokerName,pbVar10);
LAB_001a0f80:
      std::__cxx11::string::~string((string *)&res);
    }
    if ((brokerName->_M_string_length == 0) &&
       ((__x_00._M_str = pcVar17, __x_00._M_len = (size_t)local_310, __y_00._M_str = "brokers",
        __y_00._M_len = 7, bVar8 = std::operator==(__x_00,__y_00), bVar8 ||
        (__x_01._M_str = query._M_str, __x_01._M_len = (size_t)jVar18, __y_01._M_str = "brokers",
        __y_01._M_len = 7, bVar8 = std::operator==(__x_01,__y_01), bVar8)))) goto LAB_001a0faf;
  }
  bVar8 = std::operator==(brokerName,"brokers");
  if (bVar8) {
LAB_001a0faf:
    helics::BrokerFactory::getAllBrokers();
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&base,(nullptr_t)0x0);
    init._M_len = 0;
    init._M_array = (iterator)&type_1;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&base,"brokers");
    vVar2 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = (value_t)type_1._M_dataplus._M_p;
    type_1._M_dataplus._M_p._0_1_ = vVar2;
    nVar3 = (pvVar13->m_data).m_value.number_unsigned;
    (pvVar13->m_data).m_value.number_unsigned = type_1._M_string_length;
    type_1._M_string_length = nVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&type_1);
    local_310 = local_f0[0];
    for (p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_f4,_brks);
        p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310.object;
        p_Var19 = p_Var19 + 1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&res,(nullptr_t)0x0);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (**(code **)(*p_Var19->_vptr__Sp_counted_base + 0x58))();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_2e8,pbVar10);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&res,"name");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = (value_t)local_2e8._M_dataplus._M_p;
      jVar18 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = (json_value)local_2e8._M_string_length;
      local_2e8._M_dataplus._M_p._0_1_ = vVar2;
      local_2e8._M_string_length = (size_type)jVar18;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_2e8);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (**(code **)(*p_Var19->_vptr__Sp_counted_base + 0x60))();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&errorMessage,pbVar10);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&res,"address");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = (value_t)errorMessage._M_dataplus._M_p;
      errorMessage._M_dataplus._M_p._0_1_ = vVar2;
      nVar3 = (pvVar13->m_data).m_value.number_unsigned;
      (pvVar13->m_data).m_value.number_unsigned = errorMessage._M_string_length;
      errorMessage._M_string_length = nVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&errorMessage);
      useUuid_1 = (bool)(**(code **)(*p_Var19->_vptr__Sp_counted_base + 0x20))();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<bool,_bool,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&type,&useUuid_1);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&res,"isConnected");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = (value_t)type._M_dataplus._M_p;
      type._M_dataplus._M_p._0_1_ = vVar2;
      nVar3 = (pvVar13->m_data).m_value.number_unsigned;
      (pvVar13->m_data).m_value.number_unsigned = type._M_string_length;
      type._M_string_length = nVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&type);
      useUuid_1 = (bool)(**(code **)(*p_Var19->_vptr__Sp_counted_base + 0x38))();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<bool,_bool,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&uuid1,&useUuid_1);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&res,"isOpen");
      uVar6 = uuid1;
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = uuid1.data[0];
      uuid1.data[0] = vVar2;
      uVar7.data = uuid1.data;
      poVar4 = (pvVar13->m_data).m_value.object;
      uuid1.data._8_8_ = uVar6.data._8_8_;
      (pvVar13->m_data).m_value = (json_value)uuid1.data._8_8_;
      uuid1.data._0_8_ = uVar7.data._0_8_;
      uuid1.data._8_8_ = poVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&uuid1);
      useUuid_1 = (bool)(**(code **)(*p_Var19->_vptr__Sp_counted_base + 0x30))();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<bool,_bool,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&brkr,&useUuid_1);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&res,"isRoot");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type =
           (value_t)brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT71(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_
                    ,vVar2);
      jVar18 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value =
           (json_value)
           brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar18;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&brkr);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&base,"brokers");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&res);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&res);
    }
    helics::fileops::generateJsonString((string *)&res,&base,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&base.m_data);
    CLI::std::
    vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
    ~vector(&brks);
    __return_storage_ptr__->first = OK;
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res._M_dataplus._M_p == &res.field_2) {
      paVar1->_M_allocated_capacity = res.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = res.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = res._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           res.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->second)._M_string_length = res._M_string_length;
    res._M_string_length = 0;
    res.field_2._M_allocated_capacity = res.field_2._M_allocated_capacity & 0xffffffffffffff00;
    res._M_dataplus._M_p = (pointer)&res.field_2;
    std::__cxx11::string::~string((string *)&res);
    return __return_storage_ptr__;
  }
  brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((char *)brokerName->_M_string_length == (char *)0x0) {
    if (local_310 != (json_value)0x0) {
      brokerName_02._M_str = (char *)local_310;
      brokerName_02._M_len = (size_t)&res;
      helics::BrokerFactory::findBroker(brokerName_02);
      goto LAB_001a1305;
    }
LAB_001a1330:
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[7]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [7])fields);
    if ((pointer)res._M_dataplus._M_p !=
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      if (jVar18.object == (object_t *)0x0) {
        query._M_len = (size_t)local_310;
        jVar18 = local_310;
        query._M_str = pcVar17;
LAB_001a13cd:
        pcVar17 = (brokerName->_M_dataplus)._M_p;
        local_310 = (json_value)brokerName->_M_string_length;
      }
      else if (local_310 == (json_value)0x0) goto LAB_001a13cd;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"broker",(allocator<char> *)&base);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      brokerName_03._M_str = (char *)pbVar10->_M_string_length;
      brokerName_03._M_len = (size_t)&brks;
      helics::BrokerFactory::findBroker(brokerName_03);
      CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&brks);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f0);
      std::__cxx11::string::~string((string *)&res);
    }
  }
  else {
    brokerName_01._M_str = (char *)brokerName->_M_string_length;
    brokerName_01._M_len = (size_t)&res;
    helics::BrokerFactory::findBroker(brokerName_01);
LAB_001a1305:
    CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&res);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res._M_string_length);
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_001a1330;
  }
  switch(command) {
  case CREATE:
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::operator+(&res,brokerName," already exists");
      __return_storage_ptr__->first = BAD_REQUEST;
      goto LAB_001a1b66;
    }
    errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
    errorMessage._M_string_length = 0;
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    errorMessage.field_2._M_local_buf[0] = '\0';
    type.field_2._M_local_buf[0] = '\0';
    base.m_data._0_8_ = &local_2a0;
    base.m_data.m_value.object = (object_t *)0x0;
    useUuid = false;
    local_2a0._M_local_buf[0] = '\0';
    type_1._M_dataplus._M_p = (pointer)&type_1.field_2;
    type_1._M_string_length = 0;
    type_1.field_2._M_local_buf[0] = '\0';
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[5]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [5])fields);
    if ((pointer)res._M_dataplus._M_p !=
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"args",(allocator<char> *)&local_2e8);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,pbVar10);
      std::__cxx11::string::~string((string *)&res);
    }
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[5]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [5])fields);
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[9]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                       *)&res,(char (*) [9])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"CoreType",(allocator<char> *)&local_2e8);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&res);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&type_1,pbVar10);
        goto LAB_001a1d2a;
      }
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[10]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        *)&res,(char (*) [10])fields);
      pcVar17 = extraout_RDX_00;
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"core_type",(allocator<char> *)&local_2e8);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&res);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&type_1,pbVar10);
        goto LAB_001a1d2a;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"type",(allocator<char> *)&local_2e8);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&type_1,pbVar10);
LAB_001a1d2a:
      std::__cxx11::string::~string((string *)&res);
      pcVar17 = extraout_RDX_01;
    }
    if (type_1._M_string_length == 0) {
      type_00 = DEFAULT;
LAB_001a1dbd:
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[9]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                       *)&res,(char (*) [9])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,"num_feds",(allocator<char> *)&uuid1);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&local_2e8);
        std::operator+(&res," -f ",pbVar10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,&res);
        std::__cxx11::string::~string((string *)&res);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[12]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        *)&res,(char (*) [12])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,"num_brokers",(allocator<char> *)&uuid1);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&local_2e8);
        std::operator+(&res," --minbrokers=",pbVar10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,&res);
        std::__cxx11::string::~string((string *)&res);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[5]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                       *)&res,(char (*) [5])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,"port",(allocator<char> *)&uuid1);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&local_2e8);
        std::operator+(&res," --port=",pbVar10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,&res);
        std::__cxx11::string::~string((string *)&res);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[5]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                       *)&res,(char (*) [5])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,"host",(allocator<char> *)&uuid1);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&local_2e8);
        std::operator+(&res," --interface=",pbVar10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,&res);
        std::__cxx11::string::~string((string *)&res);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[10]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        *)&res,(char (*) [10])fields);
      if ((pointer)res._M_dataplus._M_p !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,"log_level",(allocator<char> *)&uuid1);
        pbVar10 = boost::container::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  ::at(fields,&local_2e8);
        std::operator+(&res," --loglevel=",pbVar10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,&res);
        std::__cxx11::string::~string((string *)&res);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      useUuid_1 = false;
      pcVar17 = (char *)brokerName->_M_string_length;
      if (pcVar17 == (char *)0x0) {
        uuid1.data = (uint8_t  [16])boost::uuids::random_generator_pure::operator()(&generator);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
        boost::uuids::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&res,&uuid1);
        std::__cxx11::stringbuf::str();
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(brokerName,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        useUuid_1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
        pcVar17 = (char *)brokerName->_M_string_length;
      }
      brokerName_00._M_len = (ulong)type_00;
      brokerName_00._M_str = pcVar17;
      configureString._M_str = (char *)base.m_data.m_value.object;
      configureString._M_len = (size_t)(brokerName->_M_dataplus)._M_p;
      helics::BrokerFactory::create((CoreType)&res,brokerName_00,configureString);
      std::
      _Tuple_impl<0ul,std::shared_ptr<helics::Broker>,std::__cxx11::string,bool,std::__cxx11::string>
      ::
      _Tuple_impl<std::shared_ptr<helics::Broker>,char_const(&)[1],bool&,std::__cxx11::string&,void>
                ((_Tuple_impl<0ul,std::shared_ptr<helics::Broker>,std::__cxx11::string,bool,std::__cxx11::string>
                  *)&brks,(shared_ptr<helics::Broker> *)&res,(char (*) [1])0x3ac614,&useUuid_1,
                 &type_1);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res._M_string_length);
    }
    else {
      type_01._M_str = pcVar17;
      type_01._M_len = (size_t)type_1._M_dataplus._M_p;
      type_00 = helics::core::coreTypeFromString((core *)type_1._M_string_length,type_01);
      bVar8 = helics::core::isCoreTypeAvailable(type_00);
      if (bVar8) goto LAB_001a1dbd;
      std::operator+(&res,&type_1," is not available");
      local_2e8._M_dataplus._M_p._0_1_ = null;
      std::_Tuple_impl<1ul,std::__cxx11::string,bool,std::__cxx11::string>::
      _Tuple_impl<std::__cxx11::string,bool,char_const(&)[1],void>
                ((_Tuple_impl<1ul,std::__cxx11::string,bool,std::__cxx11::string> *)&brks,&res,
                 (bool *)&local_2e8,(char (*) [1])0x3ac614);
      local_b0 = (element_type *)0x0;
      _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::~string((string *)&res);
    }
    std::__cxx11::string::~string((string *)&type_1);
    std::__cxx11::string::~string((string *)&base);
    res._M_dataplus._M_p = (pointer)&type;
    res._M_string_length = (size_type)&useUuid;
    res.field_2._M_allocated_capacity = (size_type)&errorMessage;
    res.field_2._8_8_ = &brkr;
    std::tuple<std::shared_ptr<helics::Broker>&,std::__cxx11::string&,bool&,std::__cxx11::string&>::
    operator=((tuple<std::shared_ptr<helics::Broker>&,std::__cxx11::string&,bool&,std::__cxx11::string&>
               *)&res,(tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&brks);
    CLI::std::
    _Tuple_impl<0UL,_std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&brks);
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __return_storage_ptr__->first = BAD_REQUEST;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,&errorMessage);
    }
    else {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&brks,(nullptr_t)0x0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,brokerName);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&brks,"broker");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_40.m_type;
      jVar18 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar2;
      local_40.m_value = jVar18;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      if (useUuid == true) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_50,brokerName);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&brks,"broker_uuid");
        vVar2 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_50.m_type;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = local_50.m_value;
        local_50.m_type = vVar2;
        local_50.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_50);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_60,&type);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&brks,"type");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_60.m_type;
      jVar18 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = local_60.m_value;
      local_60.m_type = vVar2;
      local_60.m_value = jVar18;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      helics::fileops::generateJsonString((string *)&res,(json *)&brks,true);
      __return_storage_ptr__->first = OK;
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res._M_dataplus._M_p == &res.field_2) {
        paVar1->_M_allocated_capacity = res.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = res.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = res._M_dataplus._M_p;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity =
             res.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->second)._M_string_length = res._M_string_length;
      res._M_string_length = 0;
      res.field_2._M_allocated_capacity = res.field_2._M_allocated_capacity & 0xffffffffffffff00;
      res._M_dataplus._M_p = (pointer)&res.field_2;
      std::__cxx11::string::~string((string *)&res);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&brks);
    }
    std::__cxx11::string::~string((string *)&type);
    this = &errorMessage;
    goto LAB_001a2370;
  case REMOVE:
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
        [3])(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      __return_storage_ptr__->first = OK;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->second,
                 &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                  ::emptyString_abi_cxx11_);
      break;
    }
    std::operator+(&res,brokerName," not found");
    goto LAB_001a1b5e;
  case BARRIER:
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      helics::BrokerFactory::getConnectedBroker();
      CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&res);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res._M_string_length);
      if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        res._M_dataplus._M_p._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (__return_storage_ptr__,(RequestReturnVal *)&res,
                   (char (*) [24])"unable to locate broker");
        break;
      }
    }
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[5]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)&res,(char (*) [5])fields);
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
        [0x1b])();
      __return_storage_ptr__->first = OK;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->second,
                 &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                  ::emptyString_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"time",(allocator<char> *)&brks);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      timeString._M_str = extraout_RDX;
      timeString._M_len = (size_t)(pbVar10->_M_dataplus)._M_p;
      TVar14 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                         ((utilities *)pbVar10->_M_string_length,timeString);
      std::__cxx11::string::~string((string *)&res);
      if (TVar14.internalTimeCode < 0) {
        (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
          [0x1b])();
      }
      else {
        (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
          [0x1a])(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  TVar14.internalTimeCode);
      }
      __return_storage_ptr__->first = OK;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->second,
                 &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                  ::emptyString_abi_cxx11_);
    }
    break;
  case CLEAR_BARRIER:
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      helics::BrokerFactory::getConnectedBroker();
      CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&res);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res._M_string_length);
      if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        res._M_dataplus._M_p._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (__return_storage_ptr__,(RequestReturnVal *)&res,
                   (char (*) [24])"unable to locate broker");
        break;
      }
    }
    (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
      [0x1b])(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    __return_storage_ptr__->first = OK;
    std::__cxx11::string::string
              ((string *)&__return_storage_ptr__->second,
               &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                ::emptyString_abi_cxx11_);
    break;
  case COMMAND:
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      helics::BrokerFactory::getConnectedBroker();
      CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&res);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res._M_string_length);
      if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        res._M_dataplus._M_p._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (__return_storage_ptr__,(RequestReturnVal *)&res,
                   (char (*) [24])"unable to locate broker");
        break;
      }
    }
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[12]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                      *)&res,(char (*) [12])fields);
    peVar5 = brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((pointer)res._M_dataplus._M_p ==
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
      if (jVar18.object == (object_t *)0x0) {
        res._M_dataplus._M_p._0_4_ = 400;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (__return_storage_ptr__,(RequestReturnVal *)&res,
                   (char (*) [24])"no valid command string");
        break;
      }
      (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
        [0x13])(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_310
                ,pcVar17,jVar18.object,query._M_str,0);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"command_str",(allocator<char> *)&brks);
      pbVar10 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::at(fields,&res);
      (*peVar5->_vptr_Broker[0x13])
                (peVar5,local_310,pcVar17,pbVar10->_M_string_length,(pbVar10->_M_dataplus)._M_p,0);
      std::__cxx11::string::~string((string *)&res);
    }
    __return_storage_ptr__->first = OK;
    std::__cxx11::string::string
              ((string *)&__return_storage_ptr__->second,
               &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                ::emptyString_abi_cxx11_);
    break;
  default:
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (jVar18.object == (object_t *)0x0) {
        if (local_310 != (json_value)0x0) {
          query._M_len = (size_t)local_310;
          bVar8 = true;
          pcVar20 = "root";
          jVar16 = (json_value)(char *)0x4;
          jVar18 = local_310;
          query._M_str = pcVar17;
          goto LAB_001a1986;
        }
LAB_001a1c96:
        pcStackY_330 = (char *)0xd;
        jVar18 = (json_value)pcStackY_330;
        query._M_len = 0xd;
        query._M_str = "current_state";
        pcStackY_330 = (char *)0x4;
        bVar8 = false;
        pcVar17 = "root";
      }
      else {
        bVar8 = false;
        jVar16 = local_310;
        pcVar20 = pcVar17;
LAB_001a1986:
        pcStackY_330 = (char *)0x4;
        if (jVar16.object != (object_t *)0x0) {
          pcStackY_330 = (char *)jVar16;
        }
        pcVar17 = "root";
        if (jVar16.object != (object_t *)0x0) {
          pcVar17 = pcVar20;
        }
      }
LAB_001a19a4:
      (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
        [0x11])(&res,brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                pcStackY_330,pcVar17,jVar18.object,query._M_str,0);
      sVar15 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find(&res,"\"error\"",0);
      if (sVar15 == 0xffffffffffffffff) {
        __return_storage_ptr__->first = OK;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->second,&res);
      }
      else if (bVar8) {
        (*(brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker
          [0x11])(&brks,brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  query._M_len,query._M_str,0xd,"current_state",0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(&res,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&brks);
        std::__cxx11::string::~string((string *)&brks);
        sVar15 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           (&res,"\"error\"",0);
        if (sVar15 == 0xffffffffffffffff) {
          __return_storage_ptr__->first = OK;
          std::__cxx11::string::string((string *)&__return_storage_ptr__->second,&res);
        }
        else {
          brks = (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  )0x94;
          uStack_f7 = 1;
          CLI::std::
          pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<RequestReturnVal,_const_char_(&)[17],_true>
                    (__return_storage_ptr__,(RequestReturnVal *)&brks,
                     (char (*) [17])"target not found");
        }
      }
      else {
        brks = (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                )0x94;
        uStack_f7 = 1;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[21],_true>
                  (__return_storage_ptr__,(RequestReturnVal *)&brks,
                   (char (*) [21])"query not recognized");
      }
      this = &res;
      goto LAB_001a2370;
    }
    helics::BrokerFactory::getConnectedBroker();
    CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&res);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res._M_string_length);
    if (brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (local_310 == (json_value)0x0) {
        query._M_str = (brokerName->_M_dataplus)._M_p;
        jVar18 = (json_value)brokerName->_M_string_length;
        if (jVar18.object == (object_t *)0x0) goto LAB_001a1c96;
        pcStackY_330 = (char *)0x4;
        pcVar17 = "root";
        bVar8 = false;
        query._M_len = (size_t)jVar18;
        goto LAB_001a19a4;
      }
      query._M_len = (size_t)local_310;
      pcVar20 = (brokerName->_M_dataplus)._M_p;
      jVar16 = (json_value)brokerName->_M_string_length;
      bVar8 = false;
      jVar18 = local_310;
      query._M_str = pcVar17;
      goto LAB_001a1986;
    }
    std::operator+(&res,brokerName," not found and no valid brokers");
LAB_001a1b5e:
    __return_storage_ptr__->first = NOT_FOUND;
LAB_001a1b66:
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res._M_dataplus._M_p == &res.field_2) {
      paVar1->_M_allocated_capacity = res.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = res.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = res._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           res.field_2._M_allocated_capacity;
    }
    this = &res;
    (__return_storage_ptr__->second)._M_string_length = res._M_string_length;
    res._M_string_length = 0;
    res.field_2._M_allocated_capacity = res.field_2._M_allocated_capacity & 0xffffffffffffff00;
    res._M_dataplus._M_p = (pointer)&res.field_2;
LAB_001a2370:
    std::__cxx11::string::~string((string *)this);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&brkr.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<RequestReturnVal, std::string>
    generateResults(RestCommand command,
                    std::string brokerName,
                    std::string_view target,
                    std::string_view query,
                    const boost::container::flat_map<std::string, std::string>& fields)
{
    static const std::string emptyString;
    if (command == RestCommand::UNKNOWN) {
        if (fields.find("command") != fields.end()) {
            const auto& cmdstr = fields.at("command");
            if (commandMap.find(cmdstr) != commandMap.end()) {
                command = commandMap.at(cmdstr);
                if (cmdstr == "status") {
                    query = "status";
                }
            }
        }
    }
    switch (command) {
        case RestCommand::UNKNOWN:
            return {RequestReturnVal::NOT_IMPLEMENTED, "command not recognized"};
        case RestCommand::CREATE:
            if (brokerName == "create") {
                brokerName.clear();
                break;
            }
            if (brokerName == "barrier") {
                brokerName.clear();
                command = RestCommand::BARRIER;
                break;
            }
            if (target == "barrier") {
                command = RestCommand::BARRIER;
            }
            break;
        case RestCommand::REMOVE:
            if (brokerName == "delete" || brokerName == "remove") {
                brokerName.clear();
                break;
            }
            if (brokerName == "barrier") {
                brokerName.clear();
                command = RestCommand::CLEAR_BARRIER;
                break;
            }
            if (target == "barrier") {
                command = RestCommand::CLEAR_BARRIER;
            }
            break;
        case RestCommand::QUERY:
            if (brokerName == "query" || brokerName == "search") {
                brokerName.clear();
            }
            break;
        default:
            break;
    }

    if (query.empty() && fields.find("query") != fields.end()) {
        query = fields.at("query");
    }
    if (target.empty() && fields.find("target") != fields.end()) {
        target = fields.at("target");
    }
    if (brokerName.empty()) {
        if (fields.find("broker") != fields.end()) {
            brokerName = fields.at("broker");
        } else if (fields.find("broker_uuid") != fields.end()) {
            brokerName = fields.at("broker_uuid");
        } else if (fields.find("uuid") != fields.end()) {
            brokerName = fields.at("uuid");
        }
    }
    if ((brokerName.empty() && (target == "brokers" || query == "brokers")) ||
        brokerName == "brokers") {
        return {RequestReturnVal::OK, getBrokerList()};
    }

    std::shared_ptr<helics::Broker> brkr;
    if (brokerName.empty()) {
        if (!target.empty()) {
            brkr = helics::BrokerFactory::findBroker(target);
        }
    } else {
        brkr = helics::BrokerFactory::findBroker(brokerName);
    }

    if (!brkr) {
        if (fields.find("broker") != fields.end()) {
            if (query.empty()) {
                query = target;
                target = brokerName;
            } else if (target.empty()) {
                target = brokerName;
            }
            brkr = helics::BrokerFactory::findBroker(fields.at("broker"));
        }
    }
    switch (command) {
        case RestCommand::CREATE: {
            if (brkr) {
                return {RequestReturnVal::BAD_REQUEST, brokerName + " already exists"};
            }
            std::string errorMessage;
            bool useUuid{false};
            std::string type;
            std::tie(brkr, errorMessage, useUuid, type) = createBroker(brokerName, fields);

            if (!brkr) {
                return {RequestReturnVal::BAD_REQUEST, errorMessage};
            }
            nlohmann::json retJson;
            retJson["broker"] = brokerName;
            if (useUuid) {
                retJson["broker_uuid"] = brokerName;
            }
            retJson["type"] = type;
            return {RequestReturnVal::OK, helics::fileops::generateJsonString(retJson)};
        }
        case RestCommand::REMOVE:
            if (!brkr) {
                return {RequestReturnVal::NOT_FOUND, brokerName + " not found"};
            }
            brkr->disconnect();
            return {RequestReturnVal::OK, emptyString};
        case RestCommand::BARRIER: {
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }
            if (fields.find("time") == fields.end()) {
                brkr->clearTimeBarrier();
                return {RequestReturnVal::OK, emptyString};
            }
            auto bTime = gmlc::utilities::loadTimeFromString<helics::Time>(fields.at("time"));
            if (bTime >= helics::timeZero) {
                brkr->setTimeBarrier(bTime);
            } else {
                brkr->clearTimeBarrier();
            }
            return {RequestReturnVal::OK, emptyString};
        }
        case RestCommand::COMMAND:
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }
            if (fields.find("command_str") != fields.end()) {
                brkr->sendCommand(target, fields.at("command_str"));
            } else if (!query.empty()) {
                brkr->sendCommand(target, query);
            } else {
                return {RequestReturnVal::BAD_REQUEST, "no valid command string"};
            }
            return {RequestReturnVal::OK, emptyString};
        case RestCommand::CLEAR_BARRIER:
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }

            brkr->clearTimeBarrier();
            return {RequestReturnVal::OK, emptyString};
        default:
            break;
    }  // end switch

    bool autoquery{false};
    if (!brkr) {
        brkr = helics::BrokerFactory::getConnectedBroker();
        if (!brkr) {
            return {RequestReturnVal::NOT_FOUND, brokerName + " not found and no valid brokers"};
        }
        if (target.empty()) {
            query = brokerName;
        } else {
            query = target;
            target = brokerName;
        }

    } else if (query.empty() && !target.empty()) {
        query = target;
        autoquery = true;
        target = "root";
    }
    if (target.empty()) {
        target = "root";
    }
    if (query.empty()) {
        query = "current_state";
    }
    auto res = brkr->query(target, query);
    if (res.find("\"error\"") == std::string::npos) {
        return {RequestReturnVal::OK, res};
    }

    if (autoquery) {
        res = brkr->query(query, "current_state");
        if (res.find("\"error\"") != std::string::npos) {
            return {RequestReturnVal::NOT_FOUND, "target not found"};
        }
        return {RequestReturnVal::OK, res};
    }
    return {RequestReturnVal::NOT_FOUND, "query not recognized"};
}